

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O2

void __thiscall
vkt::shaderexecutor::anon_unknown_0::CommonFunctionCase::~CommonFunctionCase
          (CommonFunctionCase *this)

{
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__CommonFunctionCase_00bdf780;
  ShaderSpec::~ShaderSpec(&this->m_spec);
  tcu::TestCase::~TestCase((TestCase *)this);
  return;
}

Assistant:

CommonFunctionCase::~CommonFunctionCase (void)
{
}